

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O0

void __thiscall QCompleter::setMaxVisibleItems(QCompleter *this,int maxItems)

{
  QCompleterPrivate *pQVar1;
  uint in_ESI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QCompleterPrivate *d;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QCompleter *)0xa6f8f9);
  if ((int)in_ESI < 0) {
    QMessageLogger::QMessageLogger
              (in_RDI,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8),
               (int)((ulong)pQVar1 >> 0x20),in_stack_ffffffffffffffb8);
    QMessageLogger::warning
              (local_28,
               "QCompleter::setMaxVisibleItems: Invalid max visible items (%d) must be >= 0",
               (ulong)in_ESI);
  }
  else {
    pQVar1->maxVisibleItems = in_ESI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCompleter::setMaxVisibleItems(int maxItems)
{
    Q_D(QCompleter);
    if (Q_UNLIKELY(maxItems < 0)) {
        qWarning("QCompleter::setMaxVisibleItems: "
                 "Invalid max visible items (%d) must be >= 0", maxItems);
        return;
    }
    d->maxVisibleItems = maxItems;
}